

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O2

void truncate<dense_parameters>(vw *all,dense_parameters *weights)

{
  weight *pwVar1;
  uint64_t uVar2;
  uint32_t uVar3;
  int iVar4;
  long lVar5;
  anon_class_1_0_00000001 local_29;
  
  if (truncate<dense_parameters>(vw&,dense_parameters&)::sd == '\0') {
    iVar4 = __cxa_guard_acquire(&truncate<dense_parameters>(vw&,dense_parameters&)::sd);
    if (iVar4 != 0) {
      truncate<dense_parameters>::sd = calculate_sd<dense_parameters>(all,weights);
      __cxa_guard_release(&truncate<dense_parameters>(vw&,dense_parameters&)::sd);
    }
  }
  pwVar1 = weights->_begin;
  uVar2 = weights->_weight_mask;
  uVar3 = weights->_stride_shift;
  for (lVar5 = 0; uVar2 * 4 + 4 != lVar5; lVar5 = lVar5 + (1L << ((byte)uVar3 & 0x3f)) * 4) {
    truncate<dense_parameters>::anon_class_1_0_00000001::operator()
              (&local_29,(float *)((long)pwVar1 + lVar5));
  }
  return;
}

Assistant:

void truncate(vw& all, T& weights)
{
  static double sd = calculate_sd(all, weights);
  for_each(weights.begin(), weights.end(), [](float& v) {
    if (abs(v) > sd * 2)
    {
      v = (float)std::remainder(v, sd * 2);
    }
  });
}